

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_canvas.hpp
# Opt level: O0

RealCanvas<plot::BrailleCanvas> * __thiscall
plot::RealCanvas<plot::BrailleCanvas>::
path<__gnu_cxx::__normal_iterator<plot::GenericPoint<float>*,std::vector<plot::GenericPoint<float>,std::allocator<plot::GenericPoint<float>>>>>
          (RealCanvas<plot::BrailleCanvas> *this,Color *color,
          __normal_iterator<plot::GenericPoint<float>_*,_std::vector<plot::GenericPoint<float>,_std::allocator<plot::GenericPoint<float>_>_>_>
          first,__normal_iterator<plot::GenericPoint<float>_*,_std::vector<plot::GenericPoint<float>,_std::allocator<plot::GenericPoint<float>_>_>_>
                last)

{
  Pointf to;
  bool bVar1;
  reference pGVar2;
  __normal_iterator<plot::GenericPoint<float>_*,_std::vector<plot::GenericPoint<float>,_std::allocator<plot::GenericPoint<float>_>_>_>
  *__lhs;
  RealCanvas<plot::BrailleCanvas> *pRVar3;
  GenericPoint<float> end;
  GenericPoint<float> start;
  Color *color_local;
  RealCanvas<plot::BrailleCanvas> *this_local;
  __normal_iterator<plot::GenericPoint<float>_*,_std::vector<plot::GenericPoint<float>,_std::allocator<plot::GenericPoint<float>_>_>_>
  last_local;
  __normal_iterator<plot::GenericPoint<float>_*,_std::vector<plot::GenericPoint<float>,_std::allocator<plot::GenericPoint<float>_>_>_>
  first_local;
  
  this_local = (RealCanvas<plot::BrailleCanvas> *)last._M_current;
  last_local = first;
  push(this);
  pGVar2 = __gnu_cxx::
           __normal_iterator<plot::GenericPoint<float>_*,_std::vector<plot::GenericPoint<float>,_std::allocator<plot::GenericPoint<float>_>_>_>
           ::operator*(&last_local);
  end = *pGVar2;
  while( true ) {
    __lhs = __gnu_cxx::
            __normal_iterator<plot::GenericPoint<float>_*,_std::vector<plot::GenericPoint<float>,_std::allocator<plot::GenericPoint<float>_>_>_>
            ::operator++(&last_local);
    bVar1 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<plot::GenericPoint<float>_*,_std::vector<plot::GenericPoint<float>,_std::allocator<plot::GenericPoint<float>_>_>_>
                              *)&this_local);
    if (!bVar1) break;
    pGVar2 = __gnu_cxx::
             __normal_iterator<plot::GenericPoint<float>_*,_std::vector<plot::GenericPoint<float>,_std::allocator<plot::GenericPoint<float>_>_>_>
             ::operator*(&last_local);
    to.x = pGVar2->x;
    to.y = pGVar2->y;
    line<>(this,color,end,to);
    end = to;
  }
  pRVar3 = pop<>(this);
  return pRVar3;
}

Assistant:

RealCanvas& path(Color const& color, Iterator first, Iterator last, Args&&... args) {
        push();
        auto start = *first;
        while (++first != last) {
            auto end = *first;
            line(color, start, end);
            start = end;
        }
        return pop(std::forward<Args>(args)...);
    }